

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilBitMatrix.c
# Opt level: O1

void Extra_BitMatrixPrint(Extra_BitMat_t *pMat)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int i;
  int iVar5;
  
  putchar(10);
  iVar1 = pMat->nSize;
  if (0 < iVar1) {
    iVar3 = 1;
    i = 0;
    iVar4 = iVar3;
    do {
      do {
        putchar(0x20);
        iVar3 = iVar3 + -1;
      } while (iVar3 != 0);
      iVar5 = i + 1;
      iVar3 = iVar5;
      if (iVar5 < iVar1) {
        do {
          iVar2 = Extra_BitMatrixLookup1(pMat,i,iVar3);
          putchar((uint)(iVar2 != 0) * 3 + 0x2e);
          iVar3 = iVar3 + 1;
        } while (iVar1 != iVar3);
      }
      putchar(10);
      iVar3 = iVar4 + 1;
      i = iVar5;
      iVar4 = iVar3;
    } while (iVar5 != iVar1);
  }
  return;
}

Assistant:

void Extra_BitMatrixPrint( Extra_BitMat_t * pMat )
{
    int i, k, nVars;
    printf( "\n" );
    nVars = Extra_BitMatrixReadSize( pMat );
    for ( i = 0; i < nVars; i++ )
    {
        for ( k = 0; k <= i; k++ )
            printf( " " );
        for ( k = i+1; k < nVars; k++ )
            if ( Extra_BitMatrixLookup1( pMat, i, k ) )
                printf( "1" );
            else
                printf( "." );
        printf( "\n" );
    }
}